

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1c6cb7::CommandLineParser::registerSubCommand
          (CommandLineParser *this,SubCommand *sub)

{
  Option *this_00;
  bool bVar1;
  difference_type dVar2;
  SubCommand *pSVar3;
  SubCommand *pSVar4;
  StringMapEntry<llvm::cl::Option_*> *this_01;
  StringRef Name;
  Option *O;
  StringMapEntry<llvm::cl::Option_*> *E;
  iterator __end3;
  iterator __begin3;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *__range3;
  SubCommand *local_20;
  SubCommand *local_18;
  SubCommand *sub_local;
  CommandLineParser *this_local;
  
  local_20 = sub;
  local_18 = sub;
  sub_local = (SubCommand *)this;
  dVar2 = llvm::
          count_if<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,(anonymous_namespace)::CommandLineParser::registerSubCommand(llvm::cl::SubCommand*)::_lambda(llvm::cl::SubCommand_const*)_1_>
                    (&this->RegisteredSubCommands,(anon_class_8_1_ba1d79a0_for__M_pred)sub);
  if (dVar2 == 0) {
    llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::insert
              ((pair<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>,_bool> *)&__range3,
               &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>,local_18
              );
    pSVar4 = local_18;
    pSVar3 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::AllSubCommands);
    if (pSVar4 != pSVar3) {
      pSVar4 = llvm::
               ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
               ::operator->((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                             *)llvm::cl::AllSubCommands);
      __end3 = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin
                         (&pSVar4->OptionsMap);
      E = (StringMapEntry<llvm::cl::Option_*> *)
          llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end(&pSVar4->OptionsMap);
      while (bVar1 = llvm::
                     iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                     ::operator!=((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                                   *)&__end3,(StringMapIterator<llvm::cl::Option_*> *)&E), bVar1) {
        this_01 = llvm::StringMapIterator<llvm::cl::Option_*>::operator*(&__end3);
        this_00 = this_01->second;
        bVar1 = llvm::cl::Option::isPositional(this_00);
        if ((((bVar1) || (bVar1 = llvm::cl::Option::isSink(this_00), bVar1)) ||
            (bVar1 = llvm::cl::Option::isConsumeAfter(this_00), bVar1)) ||
           (bVar1 = llvm::cl::Option::hasArgStr(this_00), pSVar4 = local_18, bVar1)) {
          addOption(this,this_00,local_18);
        }
        else {
          Name = llvm::StringMapEntry<llvm::cl::Option_*>::first(this_01);
          addLiteralOption(this,this_00,pSVar4,Name);
        }
        llvm::
        StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
        ::operator++(&__end3.
                      super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                    );
      }
    }
    return;
  }
  __assert_fail("count_if(RegisteredSubCommands, [sub](const SubCommand *Sub) { return (!sub->getName().empty()) && (Sub->getName() == sub->getName()); }) == 0 && \"Duplicate subcommands\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x125,
                "void (anonymous namespace)::CommandLineParser::registerSubCommand(SubCommand *)");
}

Assistant:

void registerSubCommand(SubCommand *sub) {
    assert(count_if(RegisteredSubCommands,
                    [sub](const SubCommand *Sub) {
                      return (!sub->getName().empty()) &&
                             (Sub->getName() == sub->getName());
                    }) == 0 &&
           "Duplicate subcommands");
    RegisteredSubCommands.insert(sub);

    // For all options that have been registered for all subcommands, add the
    // option to this subcommand now.
    if (sub != &*AllSubCommands) {
      for (auto &E : AllSubCommands->OptionsMap) {
        Option *O = E.second;
        if ((O->isPositional() || O->isSink() || O->isConsumeAfter()) ||
            O->hasArgStr())
          addOption(O, sub);
        else
          addLiteralOption(*O, sub, E.first());
      }
    }
  }